

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

void bgrat(double *a,double *b,double *x,double *y,double *w,double *eps,int *ierr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *eps_local;
  double *w_local;
  double *y_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  bgrat::bm1 = (*b - 0.5) - 0.5;
  bgrat::nu = bgrat::bm1 * 0.5 + *a;
  if (*y <= 0.375) {
    bgrat::T1 = -*y;
    bgrat::lnx = alnrel(&bgrat::T1);
  }
  else {
    bgrat::lnx = log(*x);
  }
  bgrat::z = -(bgrat::nu * bgrat::lnx);
  if ((*b * bgrat::z != 0.0) || (NAN(*b * bgrat::z))) {
    dVar4 = *b;
    dVar1 = gam1(b);
    dVar3 = *b;
    dVar2 = log(bgrat::z);
    dVar3 = exp(dVar3 * dVar2);
    bgrat::r = dVar4 * (dVar1 + 1.0) * dVar3;
    dVar4 = exp(*a * bgrat::lnx);
    dVar3 = exp(bgrat::bm1 * 0.5 * bgrat::lnx);
    bgrat::r = dVar4 * dVar3 * bgrat::r;
    dVar1 = algdiv(b,a);
    dVar4 = *b;
    dVar2 = log(bgrat::nu);
    dVar3 = bgrat::r;
    bgrat::u = dVar4 * dVar2 + dVar1;
    dVar4 = exp(-bgrat::u);
    bgrat::u = dVar3 * dVar4;
    if ((bgrat::u != 0.0) || (NAN(bgrat::u))) {
      grat1(b,&bgrat::z,&bgrat::r,&bgrat::p,&bgrat::q,eps);
      dVar4 = pow(1.0 / bgrat::nu,2.0);
      bgrat::v = dVar4 * 0.25;
      bgrat::t2 = bgrat::lnx * 0.25 * bgrat::lnx;
      bgrat::l = *w / bgrat::u;
      bgrat::j = bgrat::q / bgrat::r;
      bgrat::cn = 1.0;
      bgrat::t = 1.0;
      bgrat::n2 = 0.0;
      bgrat::sum = bgrat::j;
      for (bgrat::n = 1; bgrat::n < 0x1f; bgrat::n = bgrat::n + 1) {
        bgrat::bp2n = *b + bgrat::n2;
        bgrat::j = (bgrat::bp2n * (bgrat::bp2n + 1.0) * bgrat::j +
                   (bgrat::z + bgrat::bp2n + 1.0) * bgrat::t) * bgrat::v;
        bgrat::n2 = bgrat::n2 + 2.0;
        bgrat::t = bgrat::t2 * bgrat::t;
        bgrat::cn = bgrat::cn / (bgrat::n2 * (bgrat::n2 + 1.0));
        bgrat::c[bgrat::n + -1] = bgrat::cn;
        bgrat::s = 0.0;
        if (bgrat::n != 1) {
          bgrat::nm1 = bgrat::n + -1;
          bgrat::coef = *b - (double)bgrat::n;
          for (bgrat::i = 1; bgrat::i <= bgrat::nm1; bgrat::i = bgrat::i + 1) {
            bgrat::s = bgrat::coef * bgrat::c[bgrat::i + -1] * bgrat::d[(bgrat::n - bgrat::i) + -1]
                       + bgrat::s;
            bgrat::coef = *b + bgrat::coef;
          }
        }
        bgrat::d[bgrat::n + -1] = bgrat::bm1 * bgrat::cn + bgrat::s / (double)bgrat::n;
        bgrat::dj = bgrat::d[bgrat::n + -1] * bgrat::j;
        bgrat::sum = bgrat::dj + bgrat::sum;
        if (bgrat::sum <= 0.0) goto LAB_00107525;
        if (ABS(bgrat::dj) <= *eps * (bgrat::sum + bgrat::l)) break;
      }
      *ierr = 0;
      *w = bgrat::u * bgrat::sum + *w;
      return;
    }
  }
LAB_00107525:
  *ierr = 1;
  return;
}

Assistant:

void bgrat(double *a,double *b,double *x,double *y,double *w,
           double *eps,int *ierr)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) WHEN A IS LARGER THAN B.
     THE RESULT OF THE EXPANSION IS ADDED TO W. IT IS ASSUMED
     THAT A .GE. 15 AND B .LE. 1.  EPS IS THE TOLERANCE USED.
     IERR IS A VARIABLE THAT REPORTS THE STATUS OF THE RESULTS.
-----------------------------------------------------------------------
*/
{
static double bm1,bp2n,cn,coef,dj,j,l,lnx,n2,nu,p,q,r,s,sum,t,t2,u,v,z;
static int i,n,nm1;
static double c[30],d[30],T1;
/*
     ..
     .. Executable Statements ..
*/
    bm1 = *b-0.5e0-0.5e0;
    nu = *a+0.5e0*bm1;
    if(*y > 0.375e0) goto S10;
    T1 = -*y;
    lnx = alnrel(&T1);
    goto S20;
S10:
    lnx = log(*x);
S20:
    z = -(nu*lnx);
    if(*b*z == 0.0e0) goto S70;
/*
                 COMPUTATION OF THE EXPANSION
                 SET R = EXP(-Z)*Z**B/GAMMA(B)
*/
    r = *b*(1.0e0+gam1(b))*exp(*b*log(z));
    r *= (exp(*a*lnx)*exp(0.5e0*bm1*lnx));
    u = algdiv(b,a)+*b*log(nu);
    u = r*exp(-u);
    if(u == 0.0e0) goto S70;
    grat1(b,&z,&r,&p,&q,eps);
    v = 0.25e0*pow(1.0e0/nu,2.0);
    t2 = 0.25e0*lnx*lnx;
    l = *w/u;
    j = q/r;
    sum = j;
    t = cn = 1.0e0;
    n2 = 0.0e0;
    for(n=1; n<=30; n++) {
        bp2n = *b+n2;
        j = (bp2n*(bp2n+1.0e0)*j+(z+bp2n+1.0e0)*t)*v;
        n2 += 2.0e0;
        t *= t2;
        cn /= (n2*(n2+1.0e0));
        c[n-1] = cn;
        s = 0.0e0;
        if(n == 1) goto S40;
        nm1 = n-1;
        coef = *b-(double)n;
        for(i=1; i<=nm1; i++) {
            s += (coef*c[i-1]*d[n-i-1]);
            coef += *b;
        }
S40:
        d[n-1] = bm1*cn+s/(double)n;
        dj = d[n-1]*j;
        sum += dj;
        if(sum <= 0.0e0) goto S70;
        if(fabs(dj) <= *eps*(sum+l)) goto S60;
    }
S60:
/*
                    ADD THE RESULTS TO W
*/
    *ierr = 0;
    *w += (u*sum);
    return;
S70:
/*
               THE EXPANSION CANNOT BE COMPUTED
*/
    *ierr = 1;
    return;
}